

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

IdentPtr __thiscall Token::CreateIdentifier(Token *this,HashTbl *hashTbl)

{
  int iVar1;
  uint32 cch;
  char *prgch;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  IdentPtr pIVar5;
  
  if ((this->loc).filename.data_ != (char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x37,"(this->u.pid == nullptr)","this->u.pid == nullptr");
    if (!bVar3) goto LAB_00f11714;
    *puVar4 = 0;
  }
  iVar1 = (this->loc).field_1.field_0.last_column;
  if ((this->loc).filename.size_ == 0) {
    if (0x4d < iVar1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                         ,0x40,"(IsReservedWord())","IsReservedWord()");
      if (!bVar3) goto LAB_00f11714;
      *puVar4 = 0;
    }
    pIVar5 = HashTbl::PidFromTk(hashTbl,(this->loc).field_1.field_0.last_column);
  }
  else {
    if (iVar1 != 0x4e) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                         ,0x3a,"(IsIdentifier())","IsIdentifier()");
      if (!bVar3) {
LAB_00f11714:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    prgch = (char *)(this->loc).filename.size_;
    cch = (this->loc).field_1.field_0.line;
    pIVar5 = HashTbl::PidHashNameLen<char>(hashTbl,prgch,prgch + (int)cch,cch);
  }
  (this->loc).filename.data_ = (char *)pIVar5;
  return pIVar5;
}

Assistant:

IdentPtr Token::CreateIdentifier(HashTbl * hashTbl)
{
    Assert(this->u.pid == nullptr);
    if (this->u.pchMin)
    {
        Assert(IsIdentifier());
        IdentPtr pid = hashTbl->PidHashNameLen(this->u.pchMin, this->u.pchMin + this->u.length, this->u.length);
        this->u.pid = pid;
        return pid;
    }

    Assert(IsReservedWord());

    IdentPtr pid = hashTbl->PidFromTk(tk);
    this->u.pid = pid;
    return pid;
}